

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

void __thiscall senjo::TestCommandHandle::Execute(TestCommandHandle *this)

{
  byte bVar1;
  ChessEngine *pCVar2;
  size_type sVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  FILE *__stream;
  char *pcVar10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var11;
  const_iterator cVar12;
  int *piVar13;
  long lVar14;
  TestCommandHandle *pTVar15;
  int iVar16;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var17;
  int iVar18;
  undefined1 *puVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avoid;
  string bestmove;
  int seldepth;
  int depth;
  uint64_t time;
  uint64_t qnodes;
  uint64_t nodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  best;
  MoveFinder moveFinder;
  char fen [16384];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_41b8;
  int local_41ac;
  Output local_41a8;
  TestCommandHandle *local_41a0;
  int local_4198;
  int local_4194;
  int local_4190;
  int local_418c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4188;
  string local_4158;
  int local_4138;
  int local_4134;
  int local_4130;
  int local_412c;
  undefined8 local_4128;
  double dStack_4120;
  double local_4118;
  double dStack_4110;
  long local_4108;
  ulong local_4100;
  long local_40f8;
  long local_40f0;
  long local_40e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40e0;
  MoveFinder local_40b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4038 [341];
  undefined4 extraout_var;
  
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for \'test\' command",0x21);
  }
  else {
    if ((this->fileName)._M_string_length != 0) {
      local_412c = 0;
      local_4130 = 0;
      local_40e8 = 0;
      local_40f0 = 0;
      local_40f8 = 0;
      lVar14 = 0x44;
      do {
        *(undefined2 *)((long)(local_40b0.board + -1) + 4 + lVar14) = 0;
        pcVar10 = local_40b0.board[0] + lVar14;
        pcVar10[0] = 'x';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = 'x';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 0x5c);
      lVar14 = 0x5c;
      do {
        *(undefined2 *)((long)(local_40b0.board + -1) + 4 + lVar14) = 0;
        pcVar10 = local_40b0.board[0] + lVar14;
        pcVar10[0] = 'x';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = 'x';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        lVar14 = lVar14 + 0xc;
      } while (lVar14 != 0x74);
      local_40b0.ep.sqr = 0x78;
      __stream = fopen((this->fileName)._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x1e])();
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x22])();
        local_4194 = -1;
        local_4108 = 0;
        local_4100 = 0;
        local_41ac = 0;
        local_4128 = (double)((ulong)local_4128._4_4_ << 0x20);
        local_418c = -1;
        local_4198 = 0;
        local_4190 = 0;
        iVar16 = 0;
        local_4138 = 0;
        local_4134 = 0;
        iVar18 = 0;
        dVar21 = (double)0;
        local_41a0 = this;
LAB_00142e13:
        pTVar15 = local_41a0;
        pcVar10 = fgets((char *)local_4038,0x4000,__stream);
        iVar8 = iVar18;
        while (pcVar10 != (char *)0x0) {
          iVar16 = iVar16 + 1;
          local_41b8 = local_4038;
          local_4118 = dVar21;
          cVar5 = local_4038[0]._M_impl._0_1_;
          while (iVar18 = iVar8, cVar5 != '\0') {
            puVar19 = &(local_41b8->_M_impl).field_0x1;
            iVar7 = isspace((int)cVar5);
            if (iVar7 == 0) {
              if (cVar5 != '#') {
                iVar18 = iVar8 + 1;
                if ((local_41a0->skipCount == 0) || (local_41a0->skipCount <= iVar8)) {
                  Output::Output((Output *)&local_4188,InfoPrefix);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"--- Test ",9);
                  local_41ac = local_41ac + 1;
                  std::ostream::operator<<((ostream *)&std::cout,local_41ac);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout," at line ",9);
                  std::ostream::operator<<((ostream *)&std::cout,iVar16);
                  local_40e0._M_impl._0_1_ = 0x20;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)&local_40e0,1);
                  Output::operator<<((Output *)&local_4188,(char **)&local_41b8);
                  Output::~Output((Output *)&local_4188);
                  p_Var11 = local_41b8;
                  if (local_41b8 ==
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0) goto LAB_00142fae;
                  goto LAB_00142f44;
                }
              }
              break;
            }
            local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)puVar19;
            cVar5 = *puVar19;
          }
          pcVar10 = fgets((char *)local_4038,0x4000,__stream);
          dVar21 = local_4118;
          iVar8 = iVar18;
          pTVar15 = local_41a0;
        }
LAB_001436d3:
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- Completed ",0xe);
        uVar4 = local_4100;
        lVar14 = local_4108;
        iVar18 = local_41ac;
        std::ostream::operator<<((ostream *)&std::cout,local_41ac);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," test positions",0xf);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- Passed    ",0xe);
        std::ostream::operator<<((ostream *)&std::cout,(int)local_4128);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," passed (",9);
        dVar20 = 0.0;
        if (iVar18 != 0) {
          dVar20 = ((double)(int)local_4128 / (double)iVar18) * 100.0;
        }
        std::ostream::_M_insert<double>(dVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- Time      ",0xe);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
        auVar22._8_4_ = (int)((ulong)dVar21 >> 0x20);
        auVar22._0_8_ = dVar21;
        auVar22._12_4_ = 0x45300000;
        dStack_4110 = auVar22._8_8_ - 1.9342813113834067e+25;
        local_4118 = dStack_4110 +
                     ((double)CONCAT44(0x43300000,SUB84(dVar21,0)) - 4503599627370496.0);
        auVar23._8_4_ = iVar18 >> 0x1f;
        auVar23._0_8_ = (long)iVar18;
        auVar23._12_4_ = 0x45300000;
        dStack_4120 = auVar23._8_8_ - 1.9342813113834067e+25;
        local_4128 = dStack_4120 + ((double)CONCAT44(0x43300000,iVar18) - 4503599627370496.0);
        dVar20 = 0.0;
        if (iVar18 != 0) {
          dVar20 = local_4118 / local_4128;
        }
        std::ostream::_M_insert<double>(dVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg)",5);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- Nodes     ",0xe);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        dVar20 = 0.0;
        if (dVar21 != 0.0) {
          dVar20 = ((double)(uVar4 / 1000) / local_4118) * 1000.0;
        }
        std::ostream::_M_insert<double>(dVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KNodes/sec",0xb);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- QNodes    ",0xe);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
        dVar21 = 0.0;
        if (uVar4 != 0) {
          auVar26._8_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar26._0_8_ = lVar14;
          auVar26._12_4_ = 0x45300000;
          auVar27._8_4_ = (int)(uVar4 >> 0x20);
          auVar27._0_8_ = uVar4;
          auVar27._12_4_ = 0x45300000;
          dVar21 = (((auVar26._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                   ((auVar27._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0))) * 100.0;
        }
        std::ostream::_M_insert<double>(dVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%)",2);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- Depth     ",0xe);
        std::ostream::operator<<((ostream *)&std::cout,local_418c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," min, ",6);
        auVar24._8_4_ = local_4134 >> 0x1f;
        auVar24._0_8_ = (long)local_4134;
        auVar24._12_4_ = 0x45300000;
        iVar16 = (int)(((auVar24._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_4134) - 4503599627370496.0)) / local_4128)
        ;
        if (iVar18 == 0) {
          iVar16 = 0;
        }
        std::ostream::operator<<((ostream *)&std::cout,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg, ",6);
        std::ostream::operator<<((ostream *)&std::cout,local_4190);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," max",4);
        Output::~Output((Output *)&local_4188);
        Output::Output((Output *)&local_4188,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--- SelDepth  ",0xe);
        std::ostream::operator<<((ostream *)&std::cout,local_4194);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," min, ",6);
        auVar25._8_4_ = local_4138 >> 0x1f;
        auVar25._0_8_ = (long)local_4138;
        auVar25._12_4_ = 0x45300000;
        iVar16 = (int)(((auVar25._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_4138) - 4503599627370496.0)) / local_4128)
        ;
        if (iVar18 == 0) {
          iVar16 = 0;
        }
        std::ostream::operator<<((ostream *)&std::cout,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," avg, ",6);
        std::ostream::operator<<((ostream *)&std::cout,local_4198);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," max",4);
        Output::~Output((Output *)&local_4188);
        (*((pTVar15->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x23])();
        fclose(__stream);
        return;
      }
      Output::Output((Output *)&local_4188,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot open \'",0xd)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(this->fileName)._M_dataplus._M_p,
                 (this->fileName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\': ",3);
      piVar13 = __errno_location();
      local_40e0._M_impl._0_8_ = strerror(*piVar13);
      Output::operator<<((Output *)&local_4188,(char **)&local_40e0);
      p_Var11 = &local_4188;
      goto LAB_001436bc;
    }
    Output::Output((Output *)local_4038,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FileName not set for \'test\' command",0x23);
  }
  p_Var11 = local_4038;
LAB_001436bc:
  Output::~Output((Output *)p_Var11);
  return;
LAB_00142f44:
  bVar1 = *(byte *)&p_Var11->_M_impl;
  if (bVar1 < 0x20) {
    if (bVar1 == 0) goto LAB_00142f78;
    if ((bVar1 == 10) || (bVar1 == 0xd)) goto LAB_00142f75;
LAB_00142f61:
    iVar8 = isspace((int)(char)bVar1);
    if (iVar8 != 0) {
      *(char *)&p_Var11->_M_impl = ' ';
    }
  }
  else if (bVar1 != 0x20) goto LAB_00142f61;
  p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&(p_Var11->_M_impl).field_0x1;
  goto LAB_00142f44;
LAB_00142f75:
  *(char *)&p_Var11->_M_impl = '\0';
LAB_00142f78:
  if (local_41b8 ==
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
LAB_00142fae:
    p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  }
  else {
    cVar5 = *(char *)&local_41b8->_M_impl;
    p_Var11 = local_41b8;
    if (cVar5 != '\0') {
      p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(local_41b8->_M_impl).field_0x1;
      do {
        p_Var17 = p_Var11;
        iVar8 = isspace((int)cVar5);
        p_Var11 = p_Var17;
        if (iVar8 == 0) break;
        cVar5 = *(char *)&p_Var17->_M_impl;
        p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(p_Var17->_M_impl).field_0x1;
        local_41b8 = p_Var17;
      } while (cVar5 != '\0');
      p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&p_Var11[-1]._M_impl.super__Rb_tree_header._M_node_count + 7);
    }
  }
  pCVar2 = (local_41a0->super_BackgroundCommand).engine;
  iVar8 = (*pCVar2->_vptr_ChessEngine[9])(pCVar2,p_Var11);
  dVar21 = local_4118;
  p_Var11 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(extraout_var,iVar8);
  pTVar15 = local_41a0;
  if ((p_Var11 ==
       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) ||
     (bVar6 = MoveFinder::LoadFEN(&local_40b0,(char *)local_41b8), pTVar15 = local_41a0, !bVar6))
  goto LAB_001436d3;
  local_4188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4188._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4188._M_impl.super__Rb_tree_header._M_header;
  local_4188._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40e0._M_impl.super__Rb_tree_header._M_header;
  local_40e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar5 = *(char *)&p_Var11->_M_impl;
  local_41b8 = p_Var11;
  local_4188._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4188._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40e0._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var11 = local_41b8, cVar5 != '\0') {
    iVar8 = isspace((int)cVar5);
    if (iVar8 == 0) {
      pcVar10 = strchr((char *)p_Var11,0x3b);
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
        cVar5 = *(char *)&local_41b8->_M_impl;
        p_Var11 = local_41b8;
      }
      if (cVar5 == 'b') {
        if (((p_Var11->_M_impl).field_0x1 == 'm') && ((p_Var11->_M_impl).field_0x2 == ' ')) {
          local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&(p_Var11->_M_impl).field_0x3;
          cVar5 = (p_Var11->_M_impl).field_0x3;
          while (p_Var11 = local_41b8, cVar5 != '\0') {
            iVar8 = isspace((int)cVar5);
            if (iVar8 == 0) {
              MoveFinder::ToCoordinates_abi_cxx11_(&local_4158,&local_40b0,(char **)&local_41b8);
              sVar3 = local_4158._M_string_length;
              if (local_4158._M_string_length != 0) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_40e0,&local_4158);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
                operator_delete(local_4158._M_dataplus._M_p);
              }
              if (sVar3 == 0) break;
              cVar5 = *(char *)&local_41b8->_M_impl;
            }
            else {
              local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(p_Var11->_M_impl).field_0x1;
              cVar5 = (p_Var11->_M_impl).field_0x1;
            }
          }
        }
      }
      else if (((cVar5 == 'a') && ((p_Var11->_M_impl).field_0x1 == 'm')) &&
              ((p_Var11->_M_impl).field_0x2 == ' ')) {
        local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&(p_Var11->_M_impl).field_0x3;
        cVar5 = (p_Var11->_M_impl).field_0x3;
        while (p_Var11 = local_41b8, cVar5 != '\0') {
          iVar8 = isspace((int)cVar5);
          if (iVar8 == 0) {
            MoveFinder::ToCoordinates_abi_cxx11_(&local_4158,&local_40b0,(char **)&local_41b8);
            sVar3 = local_4158._M_string_length;
            if (local_4158._M_string_length != 0) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_4188,&local_4158);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
              operator_delete(local_4158._M_dataplus._M_p);
            }
            if (sVar3 == 0) break;
            cVar5 = *(char *)&local_41b8->_M_impl;
          }
          else {
            local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(p_Var11->_M_impl).field_0x1;
            cVar5 = (p_Var11->_M_impl).field_0x1;
          }
        }
      }
      if (pcVar10 == (char *)0x0) break;
      local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(pcVar10 + 1);
      cVar5 = pcVar10[1];
    }
    else {
      local_41b8 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(p_Var11->_M_impl).field_0x1;
      cVar5 = (p_Var11->_M_impl).field_0x1;
    }
  }
  pTVar15 = local_41a0;
  if (local_40e0._M_impl.super__Rb_tree_header._M_node_count == 0 &&
      local_4188._M_impl.super__Rb_tree_header._M_node_count == 0) {
    Output::Output((Output *)&local_4158,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error at line ",0xe);
    std::ostream::operator<<((ostream *)&std::cout,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", no best or avoid moves specified",0x22);
    Output::~Output((Output *)&local_4158);
    bVar6 = true;
  }
  else {
    if (local_41a0->noClear == false) {
      (*((local_41a0->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xe])();
    }
    if (pTVar15->printBoard == true) {
      (*((pTVar15->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xc])();
    }
    ChessEngine::Go(&local_4158,(pTVar15->super_BackgroundCommand).engine,pTVar15->maxDepth,0,
                    pTVar15->maxTime,0,0,0,0,(string *)0x0);
    Output::Output(&local_41a8,NoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_4158._M_dataplus._M_p,local_4158._M_string_length);
    Output::~Output(&local_41a8);
    pCVar2 = (pTVar15->super_BackgroundCommand).engine;
    (*pCVar2->_vptr_ChessEngine[0x10])
              (pCVar2,&local_412c,&local_4130,&local_40e8,&local_40f0,&local_40f8,0,0,0);
    if (((local_4158._M_string_length == 0) ||
        ((local_40e0._M_impl.super__Rb_tree_header._M_node_count != 0 &&
         (cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_40e0,&local_4158),
         (_Rb_tree_header *)cVar12._M_node == &local_40e0._M_impl.super__Rb_tree_header)))) ||
       ((local_4188._M_impl.super__Rb_tree_header._M_node_count != 0 &&
        (cVar12 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_4188,&local_4158),
        (_Rb_tree_header *)cVar12._M_node != &local_4188._M_impl.super__Rb_tree_header)))) {
      Output::Output(&local_41a8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- FAILED! line ",0x11);
      std::ostream::operator<<((ostream *)&std::cout,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      std::ostream::_M_insert<double>(((double)(int)local_4128 / (double)local_41ac) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%) ",3);
      Output::operator<<(&local_41a8,(char **)&local_41b8);
    }
    else {
      Output::Output(&local_41a8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--- Passed. line ",0x11);
      std::ostream::operator<<((ostream *)&std::cout,iVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
      iVar8 = (int)local_4128 + 1;
      local_4128 = (double)CONCAT44(local_4128._4_4_,iVar8);
      std::ostream::_M_insert<double>(((double)iVar8 / (double)local_41ac) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%) ",3);
      Output::operator<<(&local_41a8,(char **)&local_41b8);
    }
    Output::~Output(&local_41a8);
    iVar7 = local_412c;
    iVar8 = local_4130;
    if (local_4190 < local_412c) {
      local_4190 = local_412c;
    }
    iVar9 = local_418c;
    if (local_412c < local_418c) {
      iVar9 = local_412c;
    }
    bVar6 = local_418c < 0;
    local_418c = iVar9;
    if (bVar6) {
      local_418c = local_412c;
    }
    if (local_4198 < local_4130) {
      local_4198 = local_4130;
    }
    iVar9 = local_4194;
    if (local_4130 < local_4194) {
      iVar9 = local_4130;
    }
    bVar6 = local_4194 < 0;
    local_4194 = iVar9;
    if (bVar6) {
      local_4194 = local_4130;
    }
    local_4100 = local_4100 + local_40e8;
    local_4108 = local_4108 + local_40f0;
    local_4118 = (double)((long)local_4118 + local_40f8);
    iVar9 = (*((pTVar15->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x20])();
    bVar6 = true;
    if ((char)iVar9 == '\0') {
      bVar6 = local_41a0->maxCount <= local_41ac && local_41a0->maxCount != 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4158._M_dataplus._M_p != &local_4158.field_2) {
      operator_delete(local_4158._M_dataplus._M_p);
    }
    local_4134 = local_4134 + iVar7;
    local_4138 = local_4138 + iVar8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4188);
  pTVar15 = local_41a0;
  dVar21 = local_4118;
  if (bVar6) goto LAB_001436d3;
  goto LAB_00142e13;
}

Assistant:

void TestCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'test' command";
    return;
  }

  if (fileName.empty()) {
    Output() << "FileName not set for 'test' command";
    return;
  }

  char     fen[16384];
  int      depth = 0;
  int      line = 0;
  int      maxSearchDepth = 0;
  int      maxSeldepth = 0;
  int      minSearchDepth = -1;
  int      minSeldepth = -1;
  int      passed = 0;
  int      positions = 0;
  int      seldepth = 0;
  int      tested = 0;
  int      totalDepth = 0;
  int      totalSeldepth = 0;
  uint64_t nodes = 0;
  uint64_t qnodes = 0;
  uint64_t time = 0;
  uint64_t totalNodes = 0;
  uint64_t totalQnodes = 0;
  uint64_t totalTime = 0;
  FILE*    fp = NULL;

  try {
    MoveFinder moveFinder;

    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    engine->ClearStopFlags();
    engine->ResetStatsTotals();

    while (fgets(fen, sizeof(fen), fp)) {
      line++;

      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if (skipCount && (positions <= skipCount)) {
        continue;
      }

      Output() << "--- Test " << (++tested) << " at line " << line << ' ' << f;
      NormalizeString(f);
      const char* next = engine->SetPosition(f);
      if (!next || !moveFinder.LoadFEN(f)) {
        break;
      }
      f += (next - f);

      // consume 'am' and 'bm' parameters
      std::set<std::string> avoid;
      std::set<std::string> best;
      while (f && *NextWord(f)) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        if (!strncmp(f, "am ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              avoid.insert(coord);
            }
            else {
              break;
            }
          }
        }
        else if (!strncmp(f, "bm ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              best.insert(coord);
            }
            else {
              break;
            }
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if (avoid.empty() && best.empty()) {
        Output() << "error at line " << line
                 << ", no best or avoid moves specified";
        break;
      }

      if (!noClear) {
        engine->ClearSearchData();
      }
      if (printBoard) {
        engine->PrintBoard();
      }

      const std::string bestmove = engine->Go(maxDepth, 0, maxTime);
      Output(Output::NoPrefix) << "bestmove " << bestmove;

      engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &time);
      if (bestmove.empty() ||
          (best.size() && !best.count(bestmove)) ||
          (avoid.size() && avoid.count(bestmove)))
      {
        Output() << "--- FAILED! line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }
      else {
        passed++;
        Output() << "--- Passed. line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }

      if (depth > maxSearchDepth) {
        maxSearchDepth = depth;
      }
      if ((minSearchDepth < 0) || (depth < minSearchDepth)) {
        minSearchDepth = depth;
      }
      if (seldepth > maxSeldepth) {
        maxSeldepth = seldepth;
      }
      if ((minSeldepth < 0) || (seldepth < minSeldepth)) {
        minSeldepth = seldepth;
      }
      totalDepth += depth;
      totalNodes += nodes;
      totalQnodes += qnodes;
      totalSeldepth += seldepth;
      totalTime += time;

      if (engine->StopRequested() || (maxCount && (tested >= maxCount))) {
        break;
      }
    }

    Output() << "--- Completed " << tested << " test positions";
    Output() << "--- Passed    " << passed << " passed ("
             << Percent(passed, tested) << "%)";
    Output() << "--- Time      " << totalTime << " ("
             << Average(totalTime, static_cast<uint64_t>(tested)) << " avg)";
    Output() << "--- Nodes     " << totalNodes << ", "
             << Rate((totalNodes / 1000), totalTime) << " KNodes/sec";
    Output() << "--- QNodes    " << totalQnodes << " ("
             << Percent(totalQnodes, totalNodes) << "%)";
    Output() << "--- Depth     " << minSearchDepth << " min, "
             << static_cast<int>(Average(totalDepth, tested)) << " avg, "
             << maxSearchDepth << " max";
    Output() << "--- SelDepth  " << minSeldepth << " min, "
             << static_cast<int>(Average(totalSeldepth, tested)) << " avg, "
             << maxSeldepth << " max";

    engine->ShowStatsTotals();
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}